

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::rescalePartialsByPartition
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  float *pfVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar15;
  bool bVar16;
  float fVar17;
  double dVar18;
  undefined1 auVar19 [16];
  float fVar20;
  uint local_38;
  long lVar12;
  long lVar13;
  long lVar14;
  
  piVar3 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternPartitionsStartPatterns;
  lVar4 = (this->super_BeagleCPUImpl<float,_1,_0>).kFlags;
  iVar15 = piVar3[partitionIndex];
  lVar9 = (long)iVar15;
  iVar2 = piVar3[(long)partitionIndex + 1];
  iVar15 = iVar15 * 4;
  do {
    if (iVar2 <= lVar9) {
      return;
    }
    uVar7 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
    auVar19 = ZEXT816(0) << 0x40;
    iVar6 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount * 4;
    uVar7 = ~((int)uVar7 >> 0x1f) & uVar7;
    uVar8 = uVar7;
    iVar10 = iVar15;
    while (bVar16 = uVar8 != 0, uVar8 = uVar8 - 1, bVar16) {
      lVar11 = (long)iVar10;
      lVar12 = (long)iVar10;
      lVar13 = (long)iVar10;
      lVar14 = (long)iVar10;
      iVar10 = iVar10 + iVar6;
      auVar19 = vmaxss_avx(ZEXT416((uint)destP[lVar11]),auVar19);
      auVar19 = vmaxss_avx(ZEXT416((uint)destP[lVar12 + 1]),auVar19);
      auVar19 = vmaxss_avx(ZEXT416((uint)destP[lVar13 + 2]),auVar19);
      auVar19 = vmaxss_avx(ZEXT416((uint)destP[lVar14 + 3]),auVar19);
    }
    uVar5 = vcmpss_avx512f(auVar19,ZEXT416(0),0);
    bVar16 = (bool)((byte)uVar5 & 1);
    fVar17 = (float)((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * auVar19._0_4_);
    fVar20 = 1.0 / fVar17;
    iVar10 = iVar15;
    while (bVar16 = uVar7 != 0, uVar7 = uVar7 - 1, bVar16) {
      pfVar1 = destP + iVar10;
      auVar19._0_4_ = fVar20 * *pfVar1;
      auVar19._4_4_ = fVar20 * pfVar1[1];
      auVar19._8_4_ = fVar20 * pfVar1[2];
      auVar19._12_4_ = fVar20 * pfVar1[3];
      *(undefined1 (*) [16])(destP + iVar10) = auVar19;
      iVar10 = iVar10 + iVar6;
    }
    local_38 = (uint)lVar4;
    if ((local_38 >> 10 & 1) == 0) {
      scaleFactors[lVar9] = fVar17;
      if (cumulativeScaleFactors != (float *)0x0) {
        dVar18 = log((double)fVar17);
        fVar17 = (float)(dVar18 + (double)cumulativeScaleFactors[lVar9]);
LAB_00143a37:
        cumulativeScaleFactors[lVar9] = fVar17;
      }
    }
    else {
      dVar18 = log((double)fVar17);
      scaleFactors[lVar9] = (float)dVar18;
      if (cumulativeScaleFactors != (float *)0x0) {
        fVar17 = (float)dVar18 + cumulativeScaleFactors[lVar9];
        goto LAB_00143a37;
      }
    }
    lVar9 = lVar9 + 1;
    iVar15 = iVar15 + 4;
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(
                                                                    REALTYPE* destP,
                                                                    REALTYPE* scaleFactors,
                                                                    REALTYPE* cumulativeScaleFactors,
                                                                    const int fillWithOnes,
                                                                    const int partitionIndex) {

    bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    for (int k = startPattern; k < endPattern; k++) {
      REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
      #pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
      #pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}